

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O1

RC __thiscall SM_Manager::PrintPageStats(SM_Manager *this)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  long *plVar4;
  long *plVar5;
  
  piVar1 = StatisticsMgr::Get(pStatisticsMgr,PF_GETPAGE);
  piVar2 = StatisticsMgr::Get(pStatisticsMgr,PF_PAGEFOUND);
  piVar3 = StatisticsMgr::Get(pStatisticsMgr,PF_PAGENOTFOUND);
  plVar5 = &std::cout;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PF Layer Statistics",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if (piVar1 == (int *)0x0) {
    plVar4 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Total number of calls to GetPage Routine: None",0x2e);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Total number of calls to GetPage Routine: ",0x2a);
    plVar4 = (long *)std::ostream::operator<<(&std::cout,*piVar1);
  }
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (piVar2 == (int *)0x0) {
    plVar4 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Number found: None",0x14);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Number found: ",0x10);
    plVar4 = (long *)std::ostream::operator<<(&std::cout,*piVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (piVar3 == (int *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Number found: None",0x14);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Number not found: ",0x14);
    plVar5 = (long *)std::ostream::operator<<(&std::cout,*piVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return 0;
}

Assistant:

RC SM_Manager::PrintPageStats(){
  int *piGP = pStatisticsMgr->Get(PF_GETPAGE);
  int *piPF = pStatisticsMgr->Get(PF_PAGEFOUND);
  int *piPNF = pStatisticsMgr->Get(PF_PAGENOTFOUND);

  cout << "PF Layer Statistics" << endl;
  cout << "-------------------" << endl;
  if(piGP)
    cout << "Total number of calls to GetPage Routine: " << *piGP << endl;
  else
    cout << "Total number of calls to GetPage Routine: None" << endl;
  if(piPF)
    cout << "  Number found: " << *piPF << endl;
  else
    cout << "  Number found: None" << endl;
  if(piPNF)
    cout << "  Number not found: " << *piPNF << endl;
  else
    cout << "  Number found: None" << endl;
  return (0);
}